

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::anon_unknown_0::Register
               (MessageLite *containing_type,int number,ExtensionInfo info)

{
  LogMessage *pLVar1;
  LogFinisher local_71;
  string local_70;
  MessageLite *local_50;
  code *local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_28;
  
  if ((anonymous_namespace)::registry_init_ != 2) {
    local_50 = (MessageLite *)&PTR__FunctionClosure0_0028f7c8;
    local_48 = InitRegistry;
    local_40 = local_40 & 0xffffff00;
    GoogleOnceInitImpl(&(anonymous_namespace)::registry_init_,(Closure *)&local_50);
    FunctionClosure0::~FunctionClosure0((FunctionClosure0 *)&local_50);
  }
  local_48 = (code *)CONCAT44(local_48._4_4_,number);
  local_40._0_1_ = info.type;
  local_40._1_1_ = info.is_repeated;
  local_40._2_1_ = info.is_packed;
  local_40._3_1_ = info._3_1_;
  uStack_3c = info._4_4_;
  uStack_38 = info.field_3._0_4_;
  uStack_34 = info.field_3._4_4_;
  local_30 = info.field_3._8_4_;
  uStack_2c = info.field_3._12_4_;
  aStack_28._M_allocated_capacity._0_4_ = info.descriptor._0_4_;
  aStack_28._M_allocated_capacity._4_4_ = info.descriptor._4_4_;
  local_50 = containing_type;
  std::tr1::
  _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::_M_insert(&local_70,(anonymous_namespace)::registry_);
  if (local_70.field_2._M_local_buf[0] == '\0') {
    LogMessage::LogMessage
              ((LogMessage *)&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x55);
    pLVar1 = LogMessage::operator<<
                       ((LogMessage *)&local_50,"Multiple extension registrations for type \"");
    (*containing_type->_vptr_MessageLite[2])(&local_70,containing_type);
    pLVar1 = LogMessage::operator<<(pLVar1,&local_70);
    pLVar1 = LogMessage::operator<<(pLVar1,"\", field number ");
    pLVar1 = LogMessage::operator<<(pLVar1,number);
    pLVar1 = LogMessage::operator<<(pLVar1,".");
    LogFinisher::operator=(&local_71,pLVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    LogMessage::~LogMessage((LogMessage *)&local_50);
  }
  return;
}

Assistant:

void Register(const MessageLite* containing_type,
              int number, ExtensionInfo info) {
  ::google::protobuf::GoogleOnceInit(&registry_init_, &InitRegistry);

  if (!InsertIfNotPresent(registry_, make_pair(containing_type, number),
                          info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << containing_type->GetTypeName()
               << "\", field number " << number << ".";
  }
}